

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  _HashNode *p_Var1;
  SQHash SVar2;
  _HashNode *this_00;
  _HashNode *p_Var3;
  _HashNode *p_Var4;
  uint32_t uVar5;
  ulong uVar6;
  _HashNode *obj;
  ulong uVar7;
  SQObjectPtr *key_00;
  
  do {
    SVar2 = HashObj(&key->super_SQObject);
    uVar7 = (ulong)((uint)SVar2 & this->_numofnodes_minus_one);
    this_00 = _Get(this,key,uVar7);
    if (this_00 != (_HashNode *)0x0) {
      SQObjectPtr::operator=(&this_00->val,val);
LAB_00136383:
      return this_00 == (_HashNode *)0x0;
    }
    p_Var4 = this->_nodes;
    obj = p_Var4 + uVar7;
    if (p_Var4[uVar7].key.super_SQObject._type != OT_NULL) {
      key_00 = &p_Var4[uVar7].key;
      p_Var4 = this->_firstfree;
      SVar2 = HashObj(&key_00->super_SQObject);
      if ((p_Var4 < obj) &&
         (p_Var1 = this->_nodes + ((uint)SVar2 & this->_numofnodes_minus_one),
         this->_nodes + ((uint)SVar2 & this->_numofnodes_minus_one) != obj)) {
        do {
          p_Var3 = p_Var1;
          p_Var1 = p_Var3->next;
        } while (p_Var1 != obj);
        p_Var3->next = p_Var4;
        SQObjectPtr::operator=(&p_Var4->key,key_00);
        SQObjectPtr::operator=(&p_Var4->val,&obj->val);
        p_Var4->next = obj->next;
        SQObjectPtr::Null(key_00);
        SQObjectPtr::Null(&obj->val);
        obj->next = (_HashNode *)0x0;
      }
      else {
        p_Var4->next = obj->next;
        obj->next = p_Var4;
        obj = p_Var4;
      }
    }
    SQObjectPtr::operator=(&obj->key,key);
    p_Var4 = this->_firstfree;
    while( true ) {
      if (((p_Var4->key).super_SQObject._type == OT_NULL) && (p_Var4->next == (_HashNode *)0x0)) {
        SQObjectPtr::operator=(&obj->val,val);
        if (((key->super_SQObject)._type == OT_STRING) && (this->_numofnodes_minus_one < 0x20)) {
          uVar7 = this->_classTypeId;
          uVar5 = this->_usednodes;
          if (uVar5 == 0 || uVar7 != 0) {
            uVar6 = 0xcbf29ce484222325;
            if (uVar7 != 0) {
              uVar6 = uVar7;
            }
            uVar7 = (key->super_SQObject)._unVal.nInteger;
            this->_classTypeId =
                 (((ulong)((uint)(uVar7 >> 0x13) & 0xff) ^
                  ((ulong)((uint)(uVar7 >> 0xb) & 0xff) ^
                  ((ulong)((uint)(uVar7 >> 3) & 0xff) ^
                  (((long)obj - (long)this->_nodes) / 0x28 & 0xffU ^ uVar6) * 0x100000001b3) *
                  0x100000001b3) * 0x100000001b3) * 0x100000001b3 ^ uVar7 >> 0x1b & 0xff) *
                 0x100000001b3;
          }
        }
        else {
          this->_classTypeId = 0;
          uVar5 = this->_usednodes;
        }
        this->_usednodes = uVar5 + 1;
        goto LAB_00136383;
      }
      if (p_Var4 == this->_nodes) break;
      p_Var4 = p_Var4 + -1;
      this->_firstfree = p_Var4;
    }
    Rehash(this,true);
  } while( true );
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &__restrict key,const SQObjectPtr &__restrict val  VT_DECL_ARG)
{
    assert(sq_type(key) != OT_NULL);
    SQHash h = HashObj(key) & _numofnodes_minus_one;
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        VT_CODE(if (var_trace_arg) n->varTrace = *var_trace_arg);
        VT_TRACE_SINGLE(n, val, _ss(this)->_root_vm);
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;

    //key not found I'll insert it
    //main pos is not free

    if(sq_type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & _numofnodes_minus_one;
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            VT_COPY_SINGLE(mp, n);
            mp->key.Null();
            mp->val.Null();
            VT_CLEAR_SINGLE(mp);
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (sq_type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            VT_CODE(if (var_trace_arg) mp->varTrace = *var_trace_arg);
            VT_TRACE_SINGLE(mp, val, _ss(this)->_root_vm);

            // update class type id
            if (sq_isstring(key) && (_numofnodes_minus_one < (1<<TBL_CLASS_TYPE_MEMBER_BITS))) {
                if (_classTypeId != 0 || _usednodes==0) {
                    uint8_t insertPos = mp - _nodes;
                    _classTypeId = class_type_hash_update_1(_classTypeId ? _classTypeId : CLASS_TYPE_HASH_INIT, insertPos);

                    // Use SQString address as identifier, strings are unique, immutable and strored in a table.
                    // That means that all script strings share the same reference to SQString.
                    // 32 provides more than realistic address range.
                    uint32_t strIdBits = uint32_t( (uintptr_t(_string(key)) >> 3) & 0xFFFFFFFF );
                    _classTypeId = class_type_hash_update_4(_classTypeId, strIdBits);
                }
            } else {
                _classTypeId = 0;
            }

            ++_usednodes;

            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val  VT_CODE(VT_COMMA var_trace_arg));
}